

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O1

int get_maxparts(int chipset)

{
  int iVar1;
  
  iVar1 = 0;
  switch(chipset) {
  case 0x10:
  case 0x11:
  case 0x15:
  case 0x17:
  case 0x18:
  case 0x20:
  case 0x25:
  case 0x28:
  case 0x30:
  case 0x35:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x47:
  case 0x49:
    iVar1 = 4;
    break;
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case 0x19:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x27:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x45:
  case 0x48:
  case 0x4d:
switchD_00102f94_caseD_12:
    abort();
  case 0x1a:
  case 0x1f:
  case 0x2a:
  case 0x4c:
  case 0x4e:
    break;
  case 0x31:
  case 0x36:
  case 0x43:
  case 0x4b:
    return 2;
  case 0x44:
  case 0x46:
  case 0x4a:
    return 1;
  default:
    if ((5 < chipset - 99U) || ((0x31U >> (chipset - 99U & 0x1f) & 1) == 0))
    goto switchD_00102f94_caseD_12;
  }
  return iVar1;
}

Assistant:

int get_maxparts(int chipset) {
	switch (chipset) {
		case 0x1a:
		case 0x1f:
		case 0x2a:
		case 0x4e:
		case 0x4c:
		case 0x67:
		case 0x68:
		case 0x63:
			return 0;
		case 0x10:
		case 0x15:
		case 0x11:
		case 0x17:
		case 0x18:
		case 0x20:
		case 0x25:
		case 0x28:
		case 0x30:
		case 0x35:
		case 0x40:
		case 0x41:
		case 0x42:
		case 0x47:
		case 0x49:
			return 4;
		case 0x31:
		case 0x36:
		case 0x43:
		case 0x4b:
			return 2;
		case 0x44:
		case 0x4a:
		case 0x46:
			return 1;
		default:
			abort();
	}
}